

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::flush_all_active_variables(Compiler *this)

{
  uint32_t uVar1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *this_00;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  SPIRVariable *pSVar3;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this_01;
  Parameter *pPVar4;
  uint *puVar5;
  uint global;
  uint *__end1_2;
  uint *__begin1_2;
  SmallVector<unsigned_int,_8UL> *__range1_2;
  Parameter *arg;
  Parameter *__end1_1;
  Parameter *__begin1_1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1_1;
  TypedID<(spirv_cross::Types)2> *v;
  TypedID<(spirv_cross::Types)2> *__end1;
  TypedID<(spirv_cross::Types)2> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *__range1;
  Compiler *this_local;
  
  this_00 = &this->current_function->local_variables;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::begin
                     (&this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
  pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>::end
                     (&this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>);
  for (; __end1 != pTVar2; __end1 = __end1 + 1) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    pSVar3 = get<spirv_cross::SPIRVariable>(this,uVar1);
    flush_dependees(this,pSVar3);
  }
  this_01 = &this->current_function->arguments;
  __end1_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                       (&this_01->super_VectorView<spirv_cross::SPIRFunction::Parameter>);
  pPVar4 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                     (&this_01->super_VectorView<spirv_cross::SPIRFunction::Parameter>);
  for (; __end1_1 != pPVar4; __end1_1 = __end1_1 + 1) {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1_1->id);
    pSVar3 = get<spirv_cross::SPIRVariable>(this,uVar1);
    flush_dependees(this,pSVar3);
  }
  __end1_2 = VectorView<unsigned_int>::begin
                       (&(this->global_variables).super_VectorView<unsigned_int>);
  puVar5 = VectorView<unsigned_int>::end(&(this->global_variables).super_VectorView<unsigned_int>);
  for (; __end1_2 != puVar5; __end1_2 = __end1_2 + 1) {
    pSVar3 = get<spirv_cross::SPIRVariable>(this,*__end1_2);
    flush_dependees(this,pSVar3);
  }
  flush_all_aliased_variables(this);
  return;
}

Assistant:

void Compiler::flush_all_active_variables()
{
	// Invalidate all temporaries we read from variables in this block since they were forwarded.
	// Invalidate all temporaries we read from globals.
	for (auto &v : current_function->local_variables)
		flush_dependees(get<SPIRVariable>(v));
	for (auto &arg : current_function->arguments)
		flush_dependees(get<SPIRVariable>(arg.id));
	for (auto global : global_variables)
		flush_dependees(get<SPIRVariable>(global));

	flush_all_aliased_variables();
}